

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lritdump.cc
# Opt level: O2

int extract(Options *param_1,string *name)

{
  undefined8 uVar1;
  pointer *__ptr;
  File file;
  array<char,_8192UL> buf;
  undefined1 local_20b8 [160];
  undefined1 local_2018 [8192];
  
  lrit::File::File((File *)(local_20b8 + 8),name);
  lrit::File::getData((File *)local_20b8);
  uVar1 = local_20b8._0_8_;
  while ((*(byte *)(uVar1 + *(long *)(*(long *)uVar1 + -0x18) + 0x20) & 2) == 0) {
    std::istream::read((char *)uVar1,(long)local_2018);
    std::ostream::write((char *)&std::cout,(long)local_2018);
  }
  if ((long *)local_20b8._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_20b8._0_8_ + 8))();
  }
  lrit::File::~File((File *)(local_20b8 + 8));
  return 0;
}

Assistant:

int extract(const Options&, const std::string& name) {
  auto file = lrit::File(name);

  // Streaming copy from file to standard out
  auto data = file.getData();
  auto& ifs = *data;
  auto& ofs = std::cout;
  std::array<char, 8192> buf;
  while (!ifs.eof()) {
    ifs.read(buf.data(), buf.size());
    ofs.write(buf.data(), ifs.gcount());
  }

  return 0;
}